

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<capnp::compiler::BrandedDecl> *
kj::heapArray<capnp::compiler::BrandedDecl>
          (Array<capnp::compiler::BrandedDecl> *__return_storage_ptr__,
          ArrayPtr<capnp::compiler::BrandedDecl> content)

{
  size_t size;
  undefined1 local_40 [8];
  ArrayBuilder<capnp::compiler::BrandedDecl> builder;
  ArrayPtr<capnp::compiler::BrandedDecl> content_local;
  
  builder.disposer = (ArrayDisposer *)content.ptr;
  size = ArrayPtr<capnp::compiler::BrandedDecl>::size
                   ((ArrayPtr<capnp::compiler::BrandedDecl> *)&builder.disposer);
  heapArrayBuilder<capnp::compiler::BrandedDecl>
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40,size);
  ArrayBuilder<capnp::compiler::BrandedDecl>::addAll<kj::ArrayPtr<capnp::compiler::BrandedDecl>&>
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40,
             (ArrayPtr<capnp::compiler::BrandedDecl> *)&builder.disposer);
  ArrayBuilder<capnp::compiler::BrandedDecl>::finish
            (__return_storage_ptr__,(ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40);
  ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
            ((ArrayBuilder<capnp::compiler::BrandedDecl> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(ArrayPtr<T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}